

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O0

void __thiscall
OPNMIDIplay::noteUpdate
          (OPNMIDIplay *this,size_t midCh,notes_iterator i,uint props_mask,int32_t select_adlchn)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  short sVar4;
  ushort uVar5;
  size_t sVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  OPN2 *this_00;
  pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *ppVar11;
  reference pMVar12;
  Phys *pPVar13;
  reference pOVar14;
  pl_cell<OPNMIDIplay::OpnChannel::LocationData> *ppVar15;
  ulong c_00;
  byte *pbVar16;
  double dVar17;
  uint local_170;
  byte local_169;
  byte local_121;
  double dStack_120;
  uint8_t vibrato;
  double phase;
  double bend;
  double midibend;
  MIDIchannel *chan;
  users_iterator d_2;
  uint_fast32_t brightness;
  bool is_percussion;
  MIDIchannel *ch;
  users_iterator d_1;
  users_iterator uStack_c0;
  bool do_erase_user;
  users_iterator k;
  uint16_t c_1;
  Phys *ins_1;
  uint ccount_1;
  LocationData *d;
  users_iterator ci;
  uint16_t c;
  Phys *ins;
  uint ctotal;
  uint ccount;
  Location local_64;
  OpnInstMeta *pOStack_60;
  Location my_loc;
  OpnInstMeta *ains;
  size_t midiins;
  uint8_t vol;
  double currentTone;
  int16_t noteTone;
  NoteInfo *info;
  Synth *synth;
  int32_t select_adlchn_local;
  uint props_mask_local;
  size_t midCh_local;
  OPNMIDIplay *this_local;
  notes_iterator i_local;
  
  this_local = (OPNMIDIplay *)i.cell_;
  this_00 = AdlMIDI_UPtr<OPN2,_ADLMIDI_DefaultDelete<OPN2>_>::operator*(&this->m_synth);
  ppVar11 = pl_iterator<pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo>_>::operator->
                      ((pl_iterator<pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo>_> *)&this_local);
  sVar4 = (ppVar11->value).noteTone;
  dVar1 = (ppVar11->value).currentTone;
  bVar3 = (ppVar11->value).vol;
  sVar6 = (ppVar11->value).midiins;
  pOStack_60 = (ppVar11->value).ains;
  local_64.MidCh = (uint16_t)midCh;
  local_64.note = (ppVar11->value).note;
  if (((ppVar11->value).isBlank & 1U) == 0) {
    ins._4_4_ = 0;
    uVar10 = (ppVar11->value).chip_channels_count;
    for (; ins._4_4_ < uVar10; ins._4_4_ = ins._4_4_ + 1) {
      pPVar13 = (ppVar11->value).chip_channels + ins._4_4_;
      ci.cell_._6_2_ = pPVar13->chip_chan;
      if (((select_adlchn < 0) || ((uint)ci.cell_._6_2_ == select_adlchn)) &&
         ((props_mask & 1) != 0)) {
        OPN2::setPatch(this_00,(ulong)ci.cell_._6_2_,&pPVar13->ains);
        pOVar14 = std::vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>::
                  operator[](&this->m_chipChannels,(ulong)ci.cell_._6_2_);
        d = (LocationData *)OpnChannel::find_or_create_user(pOVar14,&local_64);
        bVar8 = pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_>::is_end
                          ((pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_> *)&d);
        if (!bVar8) {
          ppVar15 = pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_>::operator->
                              ((pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_> *)&d);
          (ppVar15->value).sustained = 0;
          (ppVar15->value).vibdelay_us = 0;
          (ppVar15->value).fixed_sustain = pOStack_60->soundKeyOnMs == 40000;
          (ppVar15->value).kon_time_until_neglible_us =
               (long)(int)((uint)pOStack_60->soundKeyOnMs * 1000);
          memcpy(&(ppVar15->value).ins,pPVar13,0x22);
        }
      }
    }
    for (ins_1._4_4_ = 0; ins_1._4_4_ < (ppVar11->value).chip_channels_count;
        ins_1._4_4_ = ins_1._4_4_ + 1) {
      pPVar13 = (ppVar11->value).chip_channels + ins_1._4_4_;
      k.cell_._6_2_ = pPVar13->chip_chan;
      if ((select_adlchn < 0) || ((uint)k.cell_._6_2_ == select_adlchn)) {
        iVar7 = (int)sVar6;
        if ((props_mask & 0x20) == 0) {
          if ((props_mask & 2) != 0) {
            c_00 = (ulong)k.cell_._6_2_;
            pMVar12 = std::
                      vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
                      operator[](&this->m_midiChannels,midCh);
            OPN2::setPan(this_00,c_00,pMVar12->panning);
          }
          if ((props_mask & 4) != 0) {
            pMVar12 = std::
                      vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
                      operator[](&this->m_midiChannels,midCh);
            local_169 = 1;
            if (midCh != 9) {
              local_169 = pMVar12->is_xg_percussion;
            }
            if ((local_169 & 1) == 0) {
              local_170 = (uint)pMVar12->brightness;
            }
            else {
              local_170 = 0x7f;
            }
            d_2.cell_ = (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)(long)(int)local_170;
            if (((this->m_setup).fullRangeBrightnessCC74 & 1U) == 0) {
              if (d_2.cell_ < (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x40) {
                d_2.cell_ = (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)((long)d_2.cell_ << 1)
                ;
              }
              else {
                d_2.cell_ = (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x7f;
              }
            }
            OPN2::touchNote(this_00,(ulong)k.cell_._6_2_,(ulong)bVar3,(ulong)pMVar12->volume,
                            (ulong)pMVar12->expression,(uint8_t)d_2.cell_);
          }
          if ((props_mask & 8) != 0) {
            pOVar14 = std::vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                      ::operator[](&this->m_chipChannels,(ulong)k.cell_._6_2_);
            chan = (MIDIchannel *)OpnChannel::find_user(pOVar14,&local_64);
            bVar8 = pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_>::is_end
                              ((pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_> *)&chan
                              );
            if ((bVar8) ||
               (ppVar15 = pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_>::operator->
                                    ((pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_> *
                                     )&chan), (ppVar15->value).sustained == 0)) {
              midibend = (double)std::
                                 vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                                 ::operator[](&this->m_midiChannels,midCh);
              bend = (double)((reference)midibend)->bend * ((reference)midibend)->bendsense;
              phase = bend + (double)(int)(pPVar13->ains).noteOffset;
              dStack_120 = 0.0;
              pbVar16 = std::max<unsigned_char>
                                  (&((reference)midibend)->vibrato,
                                   &((reference)midibend)->aftertouch);
              local_121 = *pbVar16;
              pbVar16 = std::max<unsigned_char>(&local_121,&(ppVar11->value).vibrato);
              local_121 = *pbVar16;
              if (((pOStack_60->flags & 1) != 0) &&
                 (bVar8 = ::operator==(&pPVar13->ains,pOStack_60->op + 1), bVar8)) {
                dStack_120 = pOStack_60->voice2_fine_tune;
              }
              if ((local_121 != 0) &&
                 ((bVar8 = pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_>::is_end
                                     ((pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_>
                                       *)&chan), bVar8 ||
                  (ppVar15 = pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_>::
                             operator->((pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_>
                                         *)&chan),
                  *(long *)((long)midibend + 0xe0) <= (ppVar15->value).vibdelay_us)))) {
                uVar10 = (uint)local_121;
                dVar2 = *(double *)((long)midibend + 0xd8);
                dVar17 = sin(*(double *)((long)midibend + 200));
                phase = (double)uVar10 * dVar2 * dVar17 + phase;
              }
              OPN2::noteOn(this_00,(ulong)k.cell_._6_2_,dVar1 + phase + dStack_120);
              if ((this->hooks).onNote != (NoteHook)0x0) {
                (*(this->hooks).onNote)
                          ((this->hooks).onNote_userData,(int)k.cell_._6_2_,(int)sVar4,iVar7,
                           (int)bVar3,bend);
              }
            }
          }
        }
        else {
          pMVar12 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                    ::operator[](&this->m_midiChannels,midCh);
          if ((pMVar12->sustain & 1U) == 0) {
            pOVar14 = std::vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                      ::operator[](&this->m_chipChannels,(ulong)k.cell_._6_2_);
            uStack_c0 = OpnChannel::find_user(pOVar14,&local_64);
            bVar9 = pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_>::is_end
                              (&stack0xffffffffffffff40);
            bVar8 = false;
            if (!bVar9) {
              ppVar15 = pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_>::operator->
                                  (&stack0xffffffffffffff40);
              bVar8 = ((ppVar15->value).sustained & 2) == 0;
            }
            if (bVar8) {
              pOVar14 = std::
                        vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>::
                        operator[](&this->m_chipChannels,(ulong)k.cell_._6_2_);
              d_1.cell_ = (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)
                          pl_list<OPNMIDIplay::OpnChannel::LocationData>::erase
                                    (&pOVar14->users,uStack_c0.cell_);
            }
            if ((this->hooks).onNote != (NoteHook)0x0) {
              (*(this->hooks).onNote)
                        ((this->hooks).onNote_userData,(int)k.cell_._6_2_,(int)sVar4,iVar7,0,0.0);
            }
            if (bVar8) {
              pOVar14 = std::
                        vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>::
                        operator[](&this->m_chipChannels,(ulong)k.cell_._6_2_);
              bVar8 = pl_list<OPNMIDIplay::OpnChannel::LocationData>::empty(&pOVar14->users);
              if (bVar8) {
                OPN2::noteOff(this_00,(ulong)k.cell_._6_2_);
                if ((props_mask & 0x40) == 0) {
                  uVar5 = pOStack_60->soundKeyOffMs;
                  pOVar14 = std::
                            vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                            ::operator[](&this->m_chipChannels,(ulong)k.cell_._6_2_);
                  pOVar14->koff_time_until_neglible_us = (ulong)uVar5 * 1000;
                }
                else {
                  OPN2::touchNote(this_00,(ulong)k.cell_._6_2_,0,0x7f,0x7f,'\x7f');
                  pOVar14 = std::
                            vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                            ::operator[](&this->m_chipChannels,(ulong)k.cell_._6_2_);
                  pOVar14->koff_time_until_neglible_us = 0;
                }
              }
            }
          }
          else {
            pOVar14 = std::vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                      ::operator[](&this->m_chipChannels,(ulong)k.cell_._6_2_);
            ch = (MIDIchannel *)OpnChannel::find_or_create_user(pOVar14,&local_64);
            bVar8 = pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_>::is_end
                              ((pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_> *)&ch);
            if (!bVar8) {
              ppVar15 = pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_>::operator->
                                  ((pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_> *)
                                   &ch);
              (ppVar15->value).sustained = (ppVar15->value).sustained | 1;
            }
            if ((this->hooks).onNote != (NoteHook)0x0) {
              (*(this->hooks).onNote)
                        ((this->hooks).onNote_userData,(int)k.cell_._6_2_,(int)sVar4,iVar7,-1,0.0);
            }
          }
          MIDIchannel::NoteInfo::phys_erase_at(&ppVar11->value,pPVar13);
          ins_1._4_4_ = ins_1._4_4_ - 1;
        }
      }
    }
    if ((ppVar11->value).chip_channels_count == 0) {
      pMVar12 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
                operator[](&this->m_midiChannels,midCh);
      MIDIchannel::cleanupNote(pMVar12,(notes_iterator)this_local);
      pMVar12 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
                operator[](&this->m_midiChannels,midCh);
      pl_list<OPNMIDIplay::MIDIchannel::NoteInfo>::erase(&pMVar12->activenotes,(iterator)this_local)
      ;
    }
  }
  else if ((props_mask & 0x20) != 0) {
    pMVar12 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
              operator[](&this->m_midiChannels,midCh);
    pl_list<OPNMIDIplay::MIDIchannel::NoteInfo>::erase(&pMVar12->activenotes,(iterator)this_local);
  }
  return;
}

Assistant:

void OPNMIDIplay::noteUpdate(size_t midCh,
                          OPNMIDIplay::MIDIchannel::notes_iterator i,
                          unsigned props_mask,
                          int32_t select_adlchn)
{
    Synth &synth = *m_synth;
    MIDIchannel::NoteInfo &info = i->value;
    const int16_t noteTone    = info.noteTone;
    const double currentTone    = info.currentTone;
    const uint8_t vol     = info.vol;
    const size_t midiins = info.midiins;
    const OpnInstMeta &ains = *info.ains;
    OpnChannel::Location my_loc;
    my_loc.MidCh = static_cast<uint16_t>(midCh);
    my_loc.note  = info.note;

    if(info.isBlank)
    {
        if(props_mask & Upd_Off)
            m_midiChannels[midCh].activenotes.erase(i);
        return;
    }

    for(unsigned ccount = 0, ctotal = info.chip_channels_count; ccount < ctotal; ccount++)
    {
        const MIDIchannel::NoteInfo::Phys &ins = info.chip_channels[ccount];
        uint16_t c   = ins.chip_chan;

        if(select_adlchn >= 0 && c != select_adlchn) continue;

        if(props_mask & Upd_Patch)
        {
            synth.setPatch(c, ins.ains);
            OpnChannel::users_iterator ci = m_chipChannels[c].find_or_create_user(my_loc);
            if(!ci.is_end())    // inserts if necessary
            {
                OpnChannel::LocationData &d = ci->value;
                d.sustained = OpnChannel::LocationData::Sustain_None;
                d.vibdelay_us  = 0;
                d.fixed_sustain = (ains.soundKeyOnMs == static_cast<uint16_t>(opnNoteOnMaxTime));
                d.kon_time_until_neglible_us = 1000 * ains.soundKeyOnMs;
                d.ins       = ins;
            }
        }
    }

    for(unsigned ccount = 0; ccount < info.chip_channels_count; ccount++)
    {
        const MIDIchannel::NoteInfo::Phys &ins = info.chip_channels[ccount];
        uint16_t c   = ins.chip_chan;

        if(select_adlchn >= 0 && c != select_adlchn)
            continue;

        if(props_mask & Upd_Off) // note off
        {
            if(m_midiChannels[midCh].sustain == 0)
            {
                OpnChannel::users_iterator k = m_chipChannels[c].find_user(my_loc);
                bool do_erase_user = (!k.is_end() && ((k->value.sustained & OpnChannel::LocationData::Sustain_Sostenuto) == 0));
                if(do_erase_user)
                    m_chipChannels[c].users.erase(k);

                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, static_cast<int>(midiins), 0, 0.0);

                if(do_erase_user && m_chipChannels[c].users.empty())
                {
                    synth.noteOff(c);
                    if(props_mask & Upd_Mute) // Mute the note
                    {
                        synth.touchNote(c, 0);
                        m_chipChannels[c].koff_time_until_neglible_us = 0;
                    }
                    else
                    {
                        m_chipChannels[c].koff_time_until_neglible_us = 1000 * int64_t(ains.soundKeyOffMs);
                    }
                }
            }
            else
            {
                // Sustain: Forget about the note, but don't key it off.
                //          Also will avoid overwriting it very soon.
                OpnChannel::users_iterator d = m_chipChannels[c].find_or_create_user(my_loc);
                if(!d.is_end())
                    d->value.sustained |= OpnChannel::LocationData::Sustain_Pedal; // note: not erased!
                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, static_cast<int>(midiins), -1, 0.0);
            }

            info.phys_erase_at(&ins);  // decrements channel count
            --ccount;  // adjusts index accordingly
            continue;
        }

        if(props_mask & Upd_Pan)
            synth.setPan(c, m_midiChannels[midCh].panning);

        if(props_mask & Upd_Volume)
        {
            const MIDIchannel &ch = m_midiChannels[midCh];
            bool is_percussion = (midCh == 9) || ch.is_xg_percussion;
            uint_fast32_t brightness = is_percussion ? 127 : ch.brightness;

            if(!m_setup.fullRangeBrightnessCC74)
            {
                // Simulate post-High-Pass filter result which affects sounding by half level only
                if(brightness >= 64)
                    brightness = 127;
                else
                    brightness *= 2;
            }

            synth.touchNote(c,
                            vol,
                            ch.volume,
                            ch.expression,
                            static_cast<uint8_t>(brightness));
        }

        if(props_mask & Upd_Pitch)
        {
            OpnChannel::users_iterator d = m_chipChannels[c].find_user(my_loc);

            // Don't bend a sustained note
            if(d.is_end() || (d->value.sustained == OpnChannel::LocationData::Sustain_None))
            {
                MIDIchannel &chan = m_midiChannels[midCh];
                double midibend = chan.bend * chan.bendsense;
                double bend = midibend + ins.ains.noteOffset;
                double phase = 0.0;
                uint8_t vibrato = std::max(chan.vibrato, chan.aftertouch);

                vibrato = std::max(vibrato, info.vibrato);

                if((ains.flags & OpnInstMeta::Flag_Pseudo8op) && ins.ains == ains.op[1])
                {
                    phase = ains.voice2_fine_tune;
                }

                if(vibrato && (d.is_end() || d->value.vibdelay_us >= chan.vibdelay_us))
                    bend += static_cast<double>(vibrato) * chan.vibdepth * std::sin(chan.vibpos);

                synth.noteOn(c, currentTone + bend + phase);

                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, static_cast<int>(midiins), vol, midibend);
            }
        }
    }

    if(info.chip_channels_count == 0)
    {
        m_midiChannels[midCh].cleanupNote(i);
        m_midiChannels[midCh].activenotes.erase(i);
    }
}